

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

SSL_CREDENTIAL *
SSL_CREDENTIAL_new_spake2plusv1_server
          (uint8_t *context,size_t context_len,uint8_t *client_identity,size_t client_identity_len,
          uint8_t *server_identity,size_t server_identity_len,uint32_t rate_limit,uint8_t *w0,
          size_t w0_len,uint8_t *registration_record,size_t registration_record_len)

{
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Span<const_unsigned_char> server_identity_00;
  bool bVar5;
  Array<unsigned_char> *pAVar6;
  _Head_base<0UL,_ssl_credential_st_*,_false> _Var7;
  Span<const_unsigned_char> context_00;
  Span<const_unsigned_char> client_identity_00;
  _Head_base<0UL,_ssl_credential_st_*,_false> local_20;
  uint8_t *local_18;
  size_t sStack_10;
  
  if ((registration_record_len != 0x41 || w0_len != 0x20) ||
     (context == (uint8_t *)0x0 && context_len != 0)) {
    return (SSL_CREDENTIAL *)0x0;
  }
  server_identity_00.size_ = server_identity_len;
  server_identity_00.data_ = server_identity;
  context_00.size_ = (size_t)context;
  context_00.data_ = (uchar *)0x3;
  client_identity_00.size_ = (size_t)client_identity;
  client_identity_00.data_ = (uchar *)context_len;
  local_18 = server_identity;
  sStack_10 = server_identity_len;
  ssl_credential_new_spake2plusv1
            ((SSLCredentialType)&local_20,context_00,client_identity_00,server_identity_00,
             (uint32_t)client_identity_len);
  if (local_20._M_head_impl != (SSL_CREDENTIAL *)0x0) {
    pAVar6 = &(local_20._M_head_impl)->password_verifier_w0;
    bVar5 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,0x20);
    if (bVar5) {
      puVar1 = pAVar6->data_;
      uVar2 = *(undefined8 *)w0;
      uVar3 = *(undefined8 *)(w0 + 8);
      uVar4 = *(undefined8 *)(w0 + 0x18);
      *(undefined8 *)(puVar1 + 0x10) = *(undefined8 *)(w0 + 0x10);
      *(undefined8 *)(puVar1 + 0x18) = uVar4;
      *(undefined8 *)puVar1 = uVar2;
      *(undefined8 *)(puVar1 + 8) = uVar3;
      pAVar6 = &(local_20._M_head_impl)->registration_record;
      bVar5 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,0x41);
      if (bVar5) {
        memmove(pAVar6->data_,registration_record,0x41);
        _Var7._M_head_impl = local_20._M_head_impl;
        local_20._M_head_impl = (SSL_CREDENTIAL *)0x0;
        goto LAB_002617d0;
      }
    }
  }
  _Var7._M_head_impl = (SSL_CREDENTIAL *)0x0;
LAB_002617d0:
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_20);
  return _Var7._M_head_impl;
}

Assistant:

SSL_CREDENTIAL *SSL_CREDENTIAL_new_spake2plusv1_server(
    const uint8_t *context, size_t context_len, const uint8_t *client_identity,
    size_t client_identity_len, const uint8_t *server_identity,
    size_t server_identity_len, uint32_t rate_limit, const uint8_t *w0,
    size_t w0_len, const uint8_t *registration_record,
    size_t registration_record_len) {
  if (w0_len != spake2plus::kVerifierSize ||
      registration_record_len != spake2plus::kRegistrationRecordSize ||
      (context == nullptr && context_len != 0)) {
    return nullptr;
  }

  UniquePtr<SSL_CREDENTIAL> cred = ssl_credential_new_spake2plusv1(
      SSLCredentialType::kSPAKE2PlusV1Server, Span(context, context_len),
      Span(client_identity, client_identity_len),
      Span(server_identity, server_identity_len), rate_limit);
  if (!cred) {
    return nullptr;
  }

  if (!cred->password_verifier_w0.CopyFrom(Span(w0, w0_len)) ||
      !cred->registration_record.CopyFrom(
          Span(registration_record, registration_record_len))) {
    return nullptr;
  }

  return cred.release();
}